

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::MultiThreadedTest::MultiThreadedTest
          (MultiThreadedTest *this,EglTestContext *eglTestCtx,char *name,char *description,
          int threadCount,deUint64 timeoutUs)

{
  deUint64 timeoutUs_local;
  int threadCount_local;
  char *description_local;
  char *name_local;
  EglTestContext *eglTestCtx_local;
  MultiThreadedTest *this_local;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultiThreadedTest_00671670;
  this->m_threadCount = threadCount;
  this->m_initialized = false;
  this->m_startTimeUs = 0;
  this->m_timeoutUs = timeoutUs;
  std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::vector
            (&this->m_threads);
  this->m_barrierWaiters = 0;
  de::Semaphore::Semaphore(&this->m_barrierSemaphore1,0,0);
  de::Semaphore::Semaphore(&this->m_barrierSemaphore2,1,0);
  this->m_display = (EGLDisplay)0x0;
  return;
}

Assistant:

MultiThreadedTest::MultiThreadedTest (EglTestContext& eglTestCtx, const char* name, const char* description, int threadCount, deUint64 timeoutUs)
	: TestCase				(eglTestCtx, name, description)
	, m_threadCount			(threadCount)
	, m_initialized			(false)
	, m_startTimeUs			(0)
	, m_timeoutUs			(timeoutUs)

	, m_barrierWaiters		(0)
	, m_barrierSemaphore1	(0, 0)
	, m_barrierSemaphore2	(1, 0)

	, m_display				(EGL_NO_DISPLAY)
{
}